

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O2

wstring * __thiscall
PDA::Transducer::Generator::mov_abi_cxx11_
          (wstring *__return_storage_ptr__,Generator *this,Register *source,Register *dest,
          wchar_t suff)

{
  wstring local_40;
  
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)__return_storage_ptr__,L"mov",(allocator<wchar_t> *)&local_40);
  if ((int)dest == 0) {
    registerSuffix((Register *)this);
  }
  std::__cxx11::wstring::push_back((wchar_t)__return_storage_ptr__);
  std::__cxx11::wstring::append((wchar_t *)__return_storage_ptr__);
  Register::toString_abi_cxx11_(&local_40,(Register *)this);
  std::__cxx11::wstring::append((wstring *)__return_storage_ptr__);
  std::__cxx11::wstring::~wstring((wstring *)&local_40);
  std::__cxx11::wstring::append((wchar_t *)__return_storage_ptr__);
  Register::toString_abi_cxx11_(&local_40,source);
  std::__cxx11::wstring::append((wstring *)__return_storage_ptr__);
  std::__cxx11::wstring::~wstring((wstring *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::wstring Generator::mov(const Register &source, const Register &dest, const wchar_t suff)
{
    std::wstring result = L"mov";
    result += suff == L'\0' ? registerSuffix(source) : suff;
    result += L"\t";
    result += source.toString();
    result += L",\t";
    result += dest.toString();
    return result;
}